

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall
Json::BuiltStyledStreamWriter::writeWithIndent(BuiltStyledStreamWriter *this,string *value)

{
  string *value_local;
  BuiltStyledStreamWriter *this_local;
  
  if (((byte)this->field_0xd8 >> 1 & 1) == 0) {
    writeIndent(this);
  }
  std::operator<<((this->super_StreamWriter).sout_,(string *)value);
  this->field_0xd8 = this->field_0xd8 & 0xfd;
  return;
}

Assistant:

void BuiltStyledStreamWriter::writeWithIndent(JSONCPP_STRING const& value) {
  if (!indented_) writeIndent();
  *sout_ << value;
  indented_ = false;
}